

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O2

void __thiscall
qclab::qgates::Phase<std::complex<float>_>::Phase
          (Phase<std::complex<float>_> *this,int qubit,real_type theta,bool fixed)

{
  float fVar1;
  
  QGate1<std::complex<float>_>::QGate1(&this->super_QGate1<std::complex<float>_>,qubit);
  (this->super_QGate1<std::complex<float>_>).field_0xc = fixed;
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00125c88;
  fVar1 = cosf(theta);
  (this->angle_).cos_ = fVar1;
  fVar1 = sinf(theta);
  (this->angle_).sin_ = fVar1;
  return;
}

Assistant:

Phase( const int qubit , const real_type theta ,
               const bool fixed = false )
        : QGate1< T >( qubit )
        , angle_( theta )
        , QAdjustable( fixed )
        { }